

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O3

LY_ERR yin_parse_module(lysp_yin_ctx **yin_ctx,ly_in *in,lys_module *mod)

{
  char cVar1;
  lyxml_ctx *plVar2;
  ly_set *plVar3;
  LY_ERR LVar4;
  ly_stmt stmt;
  lysp_yin_ctx *plVar5;
  lysp_module *mod_00;
  ushort **ppuVar6;
  char *pcVar7;
  size_t sVar8;
  ushort *puVar9;
  char *pcVar10;
  ly_ctx *plVar11;
  lysf_ctx local_50;
  
  local_50.mod = (lys_module *)0x0;
  local_50.ext_set.size = 0;
  local_50.ext_set.count = 0;
  local_50.ext_set.field_2.dnodes = (lyd_node **)0x0;
  local_50.ctx = mod->ctx;
  plVar5 = (lysp_yin_ctx *)calloc(1,0x50);
  *yin_ctx = plVar5;
  if (plVar5 == (lysp_yin_ctx *)0x0) {
LAB_0018974f:
    ly_log(mod->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yin_parse_module");
    return LY_EMEM;
  }
  plVar5->format = LYS_IN_YIN;
  LVar4 = ly_set_new(&plVar5->parsed_mods);
  if (LVar4 != LY_SUCCESS) {
    free(*yin_ctx);
    goto LAB_0018974f;
  }
  LVar4 = lyxml_ctx_new(mod->ctx,in,&(*yin_ctx)->xmlctx);
  if (LVar4 != LY_SUCCESS) {
    return LVar4;
  }
  plVar5 = *yin_ctx;
  plVar5->main_ctx = (lysp_ctx *)plVar5;
  mod_00 = (lysp_module *)calloc(1,0x80);
  if (mod_00 == (lysp_module *)0x0) {
    ly_log(mod->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yin_parse_module");
LAB_00189844:
    ly_log_location_revert(0,0,0,1);
    return LY_SUCCESS;
  }
  mod_00->mod = mod;
  ly_set_add(plVar5->parsed_mods,mod_00,'\x01',(uint32_t *)0x0);
  plVar2 = (*yin_ctx)->xmlctx;
  stmt = yin_match_keyword(*yin_ctx,(plVar2->field_5).name,(plVar2->field_6).name_len,
                           (plVar2->field_3).prefix,(plVar2->field_4).prefix_len,LY_STMT_NONE);
  if (stmt == LY_STMT_MODULE) {
    LVar4 = yin_parse_mod(*yin_ctx,mod_00);
    if (LVar4 != LY_SUCCESS) goto LAB_00189916;
    ppuVar6 = __ctype_b_loc();
    puVar9 = *ppuVar6;
    while( true ) {
      pcVar7 = in->current;
      cVar1 = *pcVar7;
      if ((*(byte *)((long)puVar9 + (long)cVar1 * 2 + 1) & 0x20) == 0) break;
      if (cVar1 == '\n') {
        in->line = in->line + 1;
      }
      ly_in_skip(in,1);
      puVar9 = *ppuVar6;
    }
    if (cVar1 == '\0') {
      mod->parsed = mod_00;
      goto LAB_00189844;
    }
    if (*yin_ctx == (lysp_yin_ctx *)0x0) {
      plVar11 = (ly_ctx *)0x0;
    }
    else {
      plVar3 = (*yin_ctx)->parsed_mods;
      plVar11 = (ly_ctx *)**(undefined8 **)(plVar3->field_2).dnodes[plVar3->count - 1];
    }
    sVar8 = strlen(pcVar7);
    pcVar10 = "";
    if (0xf < sVar8) {
      pcVar10 = "...";
    }
    ly_vlog(plVar11,(char *)0x0,LYVE_SYNTAX,
            "Trailing garbage \"%.*s%s\" after module, expected end-of-input.",0xf,pcVar7,pcVar10);
  }
  else {
    if (stmt == LY_STMT_SUBMODULE) {
      ly_log(mod->ctx,LY_LLERR,LY_EDENIED,
             "Input data contains submodule which cannot be parsed directly without its main module."
            );
      LVar4 = LY_EINVAL;
      goto LAB_00189916;
    }
    if (*yin_ctx == (lysp_yin_ctx *)0x0) {
      plVar11 = (ly_ctx *)0x0;
    }
    else {
      plVar3 = (*yin_ctx)->parsed_mods;
      plVar11 = (ly_ctx *)**(undefined8 **)(plVar3->field_2).dnodes[plVar3->count - 1];
    }
    pcVar7 = lyplg_ext_stmt2str(stmt);
    ly_vlog(plVar11,(char *)0x0,LYVE_SYNTAX,
            "Invalid keyword \"%s\", expected \"module\" or \"submodule\".",pcVar7);
  }
  LVar4 = LY_EVALID;
LAB_00189916:
  ly_log_location_revert(0,0,0,1);
  lysp_module_free(&local_50,mod_00);
  lysp_yin_ctx_free(*yin_ctx);
  *yin_ctx = (lysp_yin_ctx *)0x0;
  return LVar4;
}

Assistant:

LY_ERR
yin_parse_module(struct lysp_yin_ctx **yin_ctx, struct ly_in *in, struct lys_module *mod)
{
    LY_ERR ret = LY_SUCCESS;
    enum ly_stmt kw = LY_STMT_NONE;
    struct lysp_module *mod_p = NULL;
    struct lysf_ctx fctx = {.ctx = mod->ctx};

    /* create context */
    *yin_ctx = calloc(1, sizeof **yin_ctx);
    LY_CHECK_ERR_RET(!(*yin_ctx), LOGMEM(mod->ctx), LY_EMEM);
    (*yin_ctx)->format = LYS_IN_YIN;
    LY_CHECK_ERR_RET(ly_set_new(&(*yin_ctx)->parsed_mods), free(*yin_ctx); LOGMEM(mod->ctx), LY_EMEM);
    LY_CHECK_RET(lyxml_ctx_new(mod->ctx, in, &(*yin_ctx)->xmlctx));
    (*yin_ctx)->main_ctx = (struct lysp_ctx *)(*yin_ctx);

    mod_p = calloc(1, sizeof *mod_p);
    LY_CHECK_ERR_GOTO(!mod_p, LOGMEM(mod->ctx), cleanup);
    mod_p->mod = mod;
    ly_set_add((*yin_ctx)->parsed_mods, mod_p, 1, NULL);

    /* check module */
    kw = yin_match_keyword(*yin_ctx, (*yin_ctx)->xmlctx->name, (*yin_ctx)->xmlctx->name_len, (*yin_ctx)->xmlctx->prefix,
            (*yin_ctx)->xmlctx->prefix_len, LY_STMT_NONE);
    if (kw == LY_STMT_SUBMODULE) {
        LOGERR(mod->ctx, LY_EDENIED, "Input data contains submodule which cannot be parsed directly without its main module.");
        ret = LY_EINVAL;
        goto cleanup;
    } else if (kw != LY_STMT_MODULE) {
        LOGVAL_PARSER((struct lysp_ctx *)*yin_ctx, LY_VCODE_MOD_SUBOMD, lyplg_ext_stmt2str(kw));
        ret = LY_EVALID;
        goto cleanup;
    }

    /* parse module substatements */
    ret = yin_parse_mod(*yin_ctx, mod_p);
    LY_CHECK_GOTO(ret, cleanup);

    /* skip possible trailing whitespaces at end of the input */
    while (isspace(in->current[0])) {
        if (in->current[0] == '\n') {
            LY_IN_NEW_LINE(in);
        }
        ly_in_skip(in, 1);
    }
    if (in->current[0]) {
        LOGVAL_PARSER((struct lysp_ctx *)*yin_ctx, LY_VCODE_TRAILING_MOD, 15, in->current,
                strlen(in->current) > 15 ? "..." : "");
        ret = LY_EVALID;
        goto cleanup;
    }

    mod->parsed = mod_p;

cleanup:
    ly_log_location_revert(0, 0, 0, 1);
    if (ret) {
        lysp_module_free(&fctx, mod_p);
        lysp_yin_ctx_free(*yin_ctx);
        *yin_ctx = NULL;
    }
    return ret;
}